

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugNodeWindow(ImGuiWindow *window,char *label)

{
  ImVec2 *pIVar1;
  float *pfVar2;
  ImVec4 *pIVar3;
  ImVec4 *pIVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  ImGuiWindow *pIVar8;
  ImGuiColorMod *pIVar9;
  float fVar10;
  ImGuiContext *pIVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  ImVec2 in_RAX;
  ImDrawList *this;
  char *pcVar15;
  long lVar16;
  char *pcVar17;
  ulong uVar18;
  char *pcVar19;
  char *pcVar20;
  char *pcVar21;
  char *pcVar22;
  char *pcVar23;
  char *pcVar24;
  char *pcVar25;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  ImVec2 local_38;
  
  if (window != (ImGuiWindow *)0x0) {
    bVar14 = window->WasActive;
    pIVar8 = GImGui->NavWindow;
    local_38 = in_RAX;
    if (bVar14 == false) {
      PushStyleColor(0,(GImGui->Style).Colors + 1);
      pcVar19 = " *Inactive*";
    }
    else {
      pcVar19 = "";
    }
    bVar12 = TreeNodeEx(label,(uint)(pIVar8 == window),"%s \'%s\'%s",label,window->Name,pcVar19);
    pIVar11 = GImGui;
    if (bVar14 == false) {
      pIVar9 = (GImGui->ColorStack).Data;
      lVar16 = (long)(GImGui->ColorStack).Size;
      pIVar3 = &pIVar9[lVar16 + -1].BackupValue;
      fVar5 = pIVar3->y;
      fVar6 = pIVar3->z;
      fVar10 = pIVar3->w;
      pIVar4 = (GImGui->Style).Colors + pIVar9[lVar16 + -1].Col;
      pIVar4->x = pIVar3->x;
      pIVar4->y = fVar5;
      pIVar4->z = fVar6;
      pIVar4->w = fVar10;
      (pIVar11->ColorStack).Size = (pIVar11->ColorStack).Size + -1;
    }
    bVar13 = IsItemHovered(0);
    if ((bVar13 & bVar14) == 1) {
      this = GetViewportDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
      local_38.x = (window->Size).x + (window->Pos).x;
      local_38.y = (window->Size).y + (window->Pos).y;
      ImDrawList::AddRect(this,&window->Pos,&local_38,0xff00ffff,0.0,0xf,1.0);
    }
    if (bVar12) {
      if (window->MemoryCompacted == true) {
        TextDisabled("Note: some memory buffers have been compacted/freed.");
      }
      uVar7 = window->Flags;
      DebugNodeDrawList(window,window->DrawList,"DrawList");
      BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)",
                 (double)(window->Pos).x,(double)(window->Pos).y,(double)(window->Size).x,
                 (double)(window->Size).y,(double)(window->ContentSize).x,
                 (double)(window->ContentSize).y,(double)(window->ContentSizeIdeal).x,
                 (double)(window->ContentSizeIdeal).y);
      pcVar19 = "Child ";
      if ((uVar7 >> 0x18 & 1) == 0) {
        pcVar19 = "";
      }
      auVar28._0_4_ = -(uint)((uVar7 & 0x10000000) == 0);
      auVar28._4_4_ = -(uint)((uVar7 & 0x8000000) == 0);
      auVar28._8_4_ = -(uint)((uVar7 & 0x4000000) == 0);
      auVar28._12_4_ = -(uint)((uVar7 & 0x2000000) == 0);
      auVar27._0_4_ = -(uint)((uVar7 & 0x40) == 0);
      auVar27._4_4_ = -(uint)((uVar7 & 0x40000) == 0);
      auVar27._8_4_ = -(uint)((uVar7 & 0x200) == 0);
      auVar27._12_4_ = -(uint)((uVar7 & 0x100) == 0);
      auVar28 = packssdw(auVar27,auVar28);
      auVar28 = packsswb(auVar28,auVar28);
      pcVar15 = "Tooltip ";
      if ((auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar15 = "";
      }
      pcVar17 = "Popup ";
      if ((auVar28 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar17 = "";
      }
      pcVar20 = "Modal ";
      if ((auVar28 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar20 = "";
      }
      pcVar21 = "ChildMenu ";
      if ((auVar28 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar21 = "";
      }
      pcVar22 = "NoSavedSettings ";
      if ((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar22 = "";
      }
      pcVar25 = "NoMouseInputs";
      if ((auVar28 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar25 = "";
      }
      pcVar23 = "NoNavInputs";
      if ((auVar28 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar23 = "";
      }
      pcVar24 = "AlwaysAutoResize";
      if ((auVar28 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar24 = "";
      }
      BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar7,pcVar19,pcVar15,pcVar17,pcVar20
                 ,pcVar21,pcVar22,pcVar25,pcVar23,pcVar24);
      pcVar19 = "X";
      if (window->ScrollbarX == false) {
        pcVar19 = "";
      }
      pcVar15 = "Y";
      if (window->ScrollbarY == false) {
        pcVar15 = "";
      }
      BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s",(double)(window->Scroll).x,
                 (double)(window->ScrollMax).x,(double)(window->Scroll).y,
                 (double)(window->ScrollMax).y,pcVar19,pcVar15);
      if ((window->Active != false) || (uVar18 = 0xffffffff, window->WasActive != false)) {
        uVar18 = (ulong)(uint)(int)window->BeginOrderWithinContext;
      }
      BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",
                 (ulong)window->Active,(ulong)window->WasActive,(ulong)window->WriteAccessed,uVar18)
      ;
      BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
                 (ulong)window->Appearing,(ulong)window->Hidden,
                 (ulong)(uint)(int)window->HiddenFramesCanSkipItems,
                 (ulong)(uint)(int)window->HiddenFramesCannotSkipItems,(ulong)window->SkipItems);
      BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X",(ulong)window->NavLastIds[0],
                 (ulong)window->NavLastIds[1],(ulong)(uint)(window->DC).NavLayerActiveMask);
      if (window->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
        pcVar19 = "NULL";
      }
      else {
        pcVar19 = window->NavLastChildNavWindow->Name;
      }
      BulletText("NavLastChildNavWindow: %s",pcVar19);
      fVar5 = window->NavRectRel[0].Min.x;
      pIVar1 = &window->NavRectRel[0].Max;
      if ((pIVar1->x <= fVar5 && fVar5 != pIVar1->x) ||
         (fVar6 = window->NavRectRel[0].Min.y, pfVar2 = &window->NavRectRel[0].Max.y,
         *pfVar2 <= fVar6 && fVar6 != *pfVar2)) {
        BulletText("NavRectRel[0]: <None>");
      }
      else {
        BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)",(double)fVar5,
                   (double)window->NavRectRel[0].Min.y,(double)window->NavRectRel[0].Max.x,
                   (double)window->NavRectRel[0].Max.y);
      }
      if (window->RootWindow != window) {
        DebugNodeWindow(window->RootWindow,"RootWindow");
      }
      if (window->ParentWindow != (ImGuiWindow *)0x0) {
        DebugNodeWindow(window->ParentWindow,"ParentWindow");
      }
      if (0 < (window->DC).ChildWindows.Size) {
        DebugNodeWindowsList(&(window->DC).ChildWindows,"ChildWindows");
      }
      if (0 < (window->ColumnsStorage).Size) {
        bVar14 = TreeNode("Columns","Columns sets (%d)");
        if (bVar14) {
          if (0 < (window->ColumnsStorage).Size) {
            lVar16 = 0;
            lVar26 = 0;
            do {
              DebugNodeColumns((ImGuiOldColumns *)
                               ((long)&((window->ColumnsStorage).Data)->ID + lVar16));
              lVar26 = lVar26 + 1;
              lVar16 = lVar16 + 0x88;
            } while (lVar26 < (window->ColumnsStorage).Size);
          }
          TreePop();
        }
      }
      DebugNodeStorage(&window->StateStorage,"Storage");
      TreePop();
    }
    return;
  }
  BulletText("%s: NULL",label);
  return;
}

Assistant:

void ImGui::DebugNodeWindow(ImGuiWindow* window, const char* label)
{
    if (window == NULL)
    {
        BulletText("%s: NULL", label);
        return;
    }

    ImGuiContext& g = *GImGui;
    const bool is_active = window->WasActive;
    ImGuiTreeNodeFlags tree_node_flags = (window == g.NavWindow) ? ImGuiTreeNodeFlags_Selected : ImGuiTreeNodeFlags_None;
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    const bool open = TreeNodeEx(label, tree_node_flags, "%s '%s'%s", label, window->Name, is_active ? "" : " *Inactive*");
    if (!is_active) { PopStyleColor(); }
    if (IsItemHovered() && is_active)
        GetForegroundDrawList(window)->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!open)
        return;

    if (window->MemoryCompacted)
        TextDisabled("Note: some memory buffers have been compacted/freed.");

    ImGuiWindowFlags flags = window->Flags;
    DebugNodeDrawList(window, window->DrawList, "DrawList");
    BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y, window->ContentSizeIdeal.x, window->ContentSizeIdeal.y);
    BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
        (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
        (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
        (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
    BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
    BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
    BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
    BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
    BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
    if (!window->NavRectRel[0].IsInverted())
        BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
    else
        BulletText("NavRectRel[0]: <None>");
    if (window->RootWindow != window)       { DebugNodeWindow(window->RootWindow, "RootWindow"); }
    if (window->ParentWindow != NULL)       { DebugNodeWindow(window->ParentWindow, "ParentWindow"); }
    if (window->DC.ChildWindows.Size > 0)   { DebugNodeWindowsList(&window->DC.ChildWindows, "ChildWindows"); }
    if (window->ColumnsStorage.Size > 0 && TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
    {
        for (int n = 0; n < window->ColumnsStorage.Size; n++)
            DebugNodeColumns(&window->ColumnsStorage[n]);
        TreePop();
    }
    DebugNodeStorage(&window->StateStorage, "Storage");
    TreePop();
}